

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O2

bool __thiscall QRenderRule::baseStyleCanDraw(QRenderRule *this)

{
  QStyleSheetBackgroundData *pQVar1;
  bool bVar2;
  char cVar3;
  
  bVar2 = hasBackground(this);
  if (!bVar2) {
    return true;
  }
  if (*(int *)(*(long *)&((this->bg).d.ptr)->brush + 4) == 0) {
    cVar3 = QPixmap::isNull();
    if (cVar3 != '\0') {
      return true;
    }
    if ((this->bg).d.ptr == (QStyleSheetBackgroundData *)0x0) goto LAB_0035476b;
  }
  cVar3 = QPixmap::isNull();
  if (cVar3 == '\0') {
    return false;
  }
  pQVar1 = (this->bg).d.ptr;
  if ((pQVar1 != (QStyleSheetBackgroundData *)0x0) &&
     (*(int *)(*(long *)&pQVar1->brush + 4) - 0xfU < 3)) {
    return (bool)(((byte)this->features & 2) >> 1);
  }
LAB_0035476b:
  return (bool)((byte)this->features & 1);
}

Assistant:

bool baseStyleCanDraw() const {
        if (!hasBackground() || (background()->brush.style() == Qt::NoBrush && bg->pixmap.isNull()))
            return true;
        if (bg && !bg->pixmap.isNull())
            return false;
        if (hasGradientBackground())
            return features & StyleFeature_BackgroundGradient;
        return features & StyleFeature_BackgroundColor;
    }